

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

size_t webrtc::WriteInt16BufferToFile(FileWrapper *file,size_t length,int16_t *buffer)

{
  int iVar1;
  size_t sVar2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> byte_array;
  
  if (file == (FileWrapper *)0x0) {
    sVar2 = 0;
  }
  else {
    iVar1 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar2 = 0;
    if (((length != 0) && (buffer != (int16_t *)0x0)) && ((char)iVar1 != '\0')) {
      byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           operator_new__(2);
      for (sVar2 = 0; length != sVar2; sVar2 = sVar2 + 1) {
        *(char *)byte_array._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (char)buffer[sVar2];
        *(undefined1 *)
         ((long)byte_array._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1) =
             *(undefined1 *)((long)buffer + sVar2 * 2 + 1);
        (**(file->super_OutStream)._vptr_OutStream)
                  (&file->super_OutStream,
                   byte_array._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,2);
      }
      (*(file->super_InStream)._vptr_InStream[9])(file);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&byte_array);
      sVar2 = length;
    }
  }
  return sVar2;
}

Assistant:

size_t WriteInt16BufferToFile(FileWrapper* file,
                              size_t length,
                              const int16_t* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[2]);

  size_t int16s_written = 0;

  for (int16s_written = 0; int16s_written < length; ++int16s_written) {
    // Get byte representation.
    byte_array[0] = buffer[int16s_written] & 0xFF;
    byte_array[1] = (buffer[int16s_written] >> 8) & 0xFF;

    file->Write(byte_array.get(), 2);
  }

  file->Flush();

  return int16s_written;
}